

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O0

string * __thiscall Quest::Name_abi_cxx11_(string *__return_storage_ptr__,Quest *this)

{
  Quest *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->quest->info);
  return __return_storage_ptr__;
}

Assistant:

std::string Quest::Name() const
{
	return this->quest->info.name;
}